

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_> *this)

{
  ParamIterator<int> *in_RDI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_> *in_stack_00000030;
  
  std::
  get<5ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
              *)0x55123c);
  ParamIterator<int>::operator++(in_RDI);
  CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,int>
  ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul,5ul>>::AdvanceIfEnd<5ul>(this)
  ;
  ComputeCurrentValue(in_stack_00000030);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }